

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall server_context::process_single_task(server_context *this,server_task *task)

{
  slot_state sVar1;
  pointer piVar2;
  pointer piVar3;
  pointer psVar4;
  uint64_t uVar5;
  server_context *psVar6;
  undefined4 uVar7;
  common_log *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  server_slot *psVar12;
  size_type sVar13;
  pointer piVar14;
  char *fmt;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  uint uVar15;
  llama_context *plVar16;
  pointer psVar17;
  int iVar18;
  undefined8 in_R8;
  llama_tokens *this_00;
  int iVar19;
  bool bVar20;
  initializer_list_t init;
  string filename;
  string filepath;
  size_t token_count;
  string local_70;
  server_context *local_50;
  llama_context *local_48;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_40;
  
  iVar19 = (int)in_R8;
  switch(task->type) {
  case SERVER_TASK_TYPE_COMPLETION:
  case SERVER_TASK_TYPE_EMBEDDING:
  case SERVER_TASK_TYPE_RERANK:
  case SERVER_TASK_TYPE_INFILL:
    if (task->id_selected_slot == -1) {
      psVar12 = get_available_slot(this,task);
    }
    else {
      psVar12 = get_slot_by_id(this,task->id_selected_slot);
    }
    if (psVar12 == (server_slot *)0x0) {
      if (common_log_verbosity_thold < 1) goto LAB_00185ef7;
      pcVar8 = common_log_main();
      uVar15 = task->id;
      fmt = "srv  %12.*s: no slot is available, defer task, id_task = %d\n";
    }
    else {
      if (psVar12->state == SLOT_STATE_IDLE) {
        bVar20 = launch_slot_with_task(this,psVar12,task);
        if (bVar20) {
          return;
        }
        if (common_log_verbosity_thold < 0) {
          return;
        }
        pcVar8 = common_log_main();
        common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,
                       "srv  %12.*s: failed to launch slot with task, id_task = %d\n",0xc,
                       "process_single_task",(ulong)(uint)task->id);
        return;
      }
LAB_00185e9e:
      if (common_log_verbosity_thold < 1) goto LAB_00185ef7;
      pcVar8 = common_log_main();
      uVar15 = task->id;
      fmt = "srv  %12.*s: requested slot is unavailable, defer task, id_task = %d\n";
    }
    common_log_add(pcVar8,GGML_LOG_LEVEL_DEBUG,fmt,0xc,"process_single_task",(ulong)uVar15);
LAB_00185ef7:
    server_queue::defer(&this->queue_tasks,task);
    return;
  case SERVER_TASK_TYPE_CANCEL:
    for (psVar17 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        psVar17 !=
        (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
        super__Vector_impl_data._M_finish; psVar17 = psVar17 + 1) {
      if (psVar17->id_task == task->id_target) {
        server_slot::release(psVar17);
        return;
      }
    }
    break;
  case SERVER_TASK_TYPE_METRICS:
    iVar19 = 0;
    init._M_len = 0;
    init._M_array = (iterator)&filename;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::array(init);
    psVar4 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar15 = 0;
    local_50 = this;
    for (psVar17 = (this->slots).super__Vector_base<server_slot,_std::allocator<server_slot>_>.
                   _M_impl.super__Vector_impl_data._M_start; iVar18 = (int)in_R8, psVar17 != psVar4;
        psVar17 = psVar17 + 1) {
      server_slot::to_json_abi_cxx11_((server_slot *)&filepath);
      sVar1 = psVar17->state;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::push_back((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&filename,
                  (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&filepath);
      bVar20 = sVar1 == SLOT_STATE_IDLE;
      uVar15 = uVar15 + bVar20;
      iVar19 = iVar19 + (uint)!bVar20;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)&filepath);
    }
    if (0 < common_log_verbosity_thold) {
      pcVar8 = common_log_main();
      iVar18 = 0x21781e;
      common_log_add(pcVar8,GGML_LOG_LEVEL_DEBUG,
                     "srv  %12.*s: n_idle_slots = %d, n_processing_slots = %d\n",0xc,
                     "process_single_task",(ulong)uVar15,iVar19);
    }
    httplib::detail::std::make_unique<server_task_result_metrics>();
    *(int *)(filepath._M_dataplus._M_p + 8) = task->id;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&local_40,
                 (basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&filename);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::operator=((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)(filepath._M_dataplus._M_p + 0x80),&local_40);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json(&local_40);
    psVar6 = local_50;
    *(uint *)(filepath._M_dataplus._M_p + 0x10) = uVar15;
    *(int *)(filepath._M_dataplus._M_p + 0x14) = iVar19;
    sVar13 = httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::size
                       (&(local_50->queue_tasks).queue_tasks_deferred);
    *(int *)(filepath._M_dataplus._M_p + 0x18) = (int)sVar13;
    *(int64_t *)(filepath._M_dataplus._M_p + 0x20) = (psVar6->metrics).t_start;
    uVar7 = llama_kv_self_n_tokens(psVar6->ctx);
    *(undefined4 *)(filepath._M_dataplus._M_p + 0x28) = uVar7;
    uVar7 = llama_kv_self_used_cells(psVar6->ctx);
    local_70._M_dataplus = filepath._M_dataplus;
    *(undefined4 *)(filepath._M_dataplus._M_p + 0x2c) = uVar7;
    uVar5 = (psVar6->metrics).t_prompt_processing_total;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x30) =
         (psVar6->metrics).n_prompt_tokens_processed_total;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x38) = uVar5;
    uVar5 = (psVar6->metrics).t_tokens_generation_total;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x40) = (psVar6->metrics).n_tokens_predicted_total;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x48) = uVar5;
    uVar5 = (psVar6->metrics).t_prompt_processing;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x50) = (psVar6->metrics).n_prompt_tokens_processed;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x58) = uVar5;
    uVar5 = (psVar6->metrics).t_tokens_generation;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x60) = (psVar6->metrics).n_tokens_predicted;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x68) = uVar5;
    uVar5 = (psVar6->metrics).n_busy_slots_total;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x70) = (psVar6->metrics).n_decode_total;
    *(uint64_t *)(filepath._M_dataplus._M_p + 0x78) = uVar5;
    if (task->metrics_reset_bucket == true) {
      (psVar6->metrics).n_tokens_predicted = 0;
      (psVar6->metrics).t_tokens_generation = 0;
      (psVar6->metrics).n_prompt_tokens_processed = 0;
      (psVar6->metrics).t_prompt_processing = 0;
    }
    filepath._M_dataplus._M_p = (pointer)0x0;
    server_response::send
              (&psVar6->queue_results,(int)&local_70,__buf_03,(size_t)local_70._M_dataplus._M_p,
               iVar18);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 0x28))();
    }
    if (filepath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)filepath._M_dataplus._M_p + 0x28))();
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&filename);
    break;
  case SERVER_TASK_TYPE_SLOT_SAVE:
    iVar19 = (task->slot_action).slot_id;
    psVar12 = get_slot_by_id(this,iVar19);
    if (psVar12 == (server_slot *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filename,"Invalid slot ID",(allocator<char> *)&filepath);
      send_error(this,task,&filename,ERROR_TYPE_INVALID_REQUEST);
    }
    else {
      if (psVar12->state != SLOT_STATE_IDLE) goto LAB_00185e9e;
      piVar14 = (psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar2 = (psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_50 = (server_context *)ggml_time_us();
      std::__cxx11::string::string((string *)&filename,(string *)&(task->slot_action).filename);
      std::__cxx11::string::string((string *)&filepath,(string *)&(task->slot_action).filepath);
      lVar11 = (long)piVar14 - (long)piVar2 >> 2;
      piVar14 = (psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = lVar11;
      lVar10 = llama_state_seq_save_file(this->ctx,filepath._M_dataplus._M_p,psVar12->id);
      iVar18 = (int)lVar9;
      lVar9 = ggml_time_us();
      httplib::detail::std::make_unique<server_task_result_slot_save_load>();
      *(int *)(local_70._M_dataplus._M_p + 8) = task->id;
      *(int *)(local_70._M_dataplus._M_p + 0xc) = iVar19;
      std::__cxx11::string::_M_assign((string *)(local_70._M_dataplus._M_p + 0x10));
      token_count = (size_t)local_70._M_dataplus._M_p;
      *(llama_context *)(local_70._M_dataplus._M_p + 0x30) = (llama_context)0x1;
      *(long *)(local_70._M_dataplus._M_p + 0x38) = lVar11;
      *(long *)(local_70._M_dataplus._M_p + 0x40) = lVar10;
      *(double *)(local_70._M_dataplus._M_p + 0x48) = (double)(lVar9 - (long)local_50) / 1000.0;
      local_70._M_dataplus._M_p = (pointer)0x0;
      server_response::send(&this->queue_results,(int)&token_count,__buf,(size_t)piVar14,iVar18);
      plVar16 = (llama_context *)token_count;
LAB_00186178:
      if (plVar16 != (llama_context *)0x0) {
        (**(code **)(*(long *)plVar16 + 0x28))();
      }
      if ((llama_context *)local_70._M_dataplus._M_p != (llama_context *)0x0) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 0x28))();
      }
LAB_0018661e:
      std::__cxx11::string::~string((string *)&filepath);
    }
    goto LAB_00186628;
  case SERVER_TASK_TYPE_SLOT_RESTORE:
    iVar19 = (task->slot_action).slot_id;
    psVar12 = get_slot_by_id(this,iVar19);
    if (psVar12 != (server_slot *)0x0) {
      if (psVar12->state == SLOT_STATE_IDLE) {
        lVar9 = ggml_time_us();
        std::__cxx11::string::string((string *)&filename,(string *)&(task->slot_action).filename);
        std::__cxx11::string::string((string *)&filepath,(string *)&(task->slot_action).filepath);
        this_00 = &psVar12->cache_tokens;
        httplib::detail::std::vector<int,_std::allocator<int>_>::resize
                  (this_00,(long)psVar12->n_ctx);
        token_count = 0;
        iVar18 = (int)((long)(psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2);
        lVar10 = llama_state_seq_load_file(this->ctx,filepath._M_dataplus._M_p,psVar12->id);
        if (lVar10 != 0) {
          httplib::detail::std::vector<int,_std::allocator<int>_>::resize(this_00,token_count);
          lVar11 = ggml_time_us();
          httplib::detail::std::make_unique<server_task_result_slot_save_load>();
          *(int *)(local_70._M_dataplus._M_p + 8) = task->id;
          *(int *)(local_70._M_dataplus._M_p + 0xc) = iVar19;
          std::__cxx11::string::_M_assign((string *)(local_70._M_dataplus._M_p + 0x10));
          local_48 = (llama_context *)local_70._M_dataplus._M_p;
          *(llama_context *)(local_70._M_dataplus._M_p + 0x30) = (llama_context)0x0;
          *(size_t *)(local_70._M_dataplus._M_p + 0x38) = token_count;
          *(long *)(local_70._M_dataplus._M_p + 0x40) = lVar10;
          *(double *)(local_70._M_dataplus._M_p + 0x48) = (double)(lVar11 - lVar9) / 1000.0;
          local_70._M_dataplus._M_p = (pointer)0x0;
          server_response::send(&this->queue_results,(int)&local_48,__buf_00,token_count,iVar18);
          plVar16 = local_48;
          goto LAB_00186178;
        }
        httplib::detail::std::vector<int,_std::allocator<int>_>::resize(this_00,0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,
                   "Unable to restore slot, no available space in KV cache or invalid slot save file"
                   ,(allocator<char> *)&local_48);
        send_error(this,task,&local_70,ERROR_TYPE_INVALID_REQUEST);
        std::__cxx11::string::~string((string *)&local_70);
        goto LAB_0018661e;
      }
      goto LAB_00185e9e;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,"Invalid slot ID",(allocator<char> *)&filepath);
    send_error(this,task,&filename,ERROR_TYPE_INVALID_REQUEST);
    goto LAB_00186628;
  case SERVER_TASK_TYPE_SLOT_ERASE:
    iVar18 = (task->slot_action).slot_id;
    psVar12 = get_slot_by_id(this,iVar18);
    if (psVar12 != (server_slot *)0x0) {
      if (psVar12->state != SLOT_STATE_IDLE) goto LAB_00185e9e;
      piVar14 = (psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar2 = (psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      llama_kv_self_seq_rm(this->ctx,psVar12->id,0xffffffff);
      piVar3 = (psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar3) {
        (psVar12->cache_tokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar3;
      }
      httplib::detail::std::make_unique<server_task_result_slot_erase>();
      filepath._M_dataplus = filename._M_dataplus;
      *(int *)(filename._M_dataplus._M_p + 8) = task->id;
      *(int *)(filename._M_dataplus._M_p + 0xc) = iVar18;
      *(long *)(filename._M_dataplus._M_p + 0x10) = (long)piVar14 - (long)piVar2 >> 2;
      filename._M_dataplus._M_p = (pointer)0x0;
      server_response::send
                (&this->queue_results,(int)&filepath,__buf_02,(size_t)filepath._M_dataplus._M_p,
                 iVar19);
      goto LAB_00186215;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,"Invalid slot ID",(allocator<char> *)&filepath);
    send_error(this,task,&filename,ERROR_TYPE_INVALID_REQUEST);
LAB_00186628:
    std::__cxx11::string::~string((string *)&filename);
    break;
  case SERVER_TASK_TYPE_SET_LORA:
    httplib::detail::std::
    vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::_M_move_assign
              (&(this->params_base).lora_adapters,&task->set_lora);
    httplib::detail::std::make_unique<server_task_result_apply_lora>();
    filepath._M_dataplus = filename._M_dataplus;
    *(int *)(filename._M_dataplus._M_p + 8) = task->id;
    filename._M_dataplus._M_p = (pointer)0x0;
    server_response::send
              (&this->queue_results,(int)&filepath,__buf_01,(size_t)filepath._M_dataplus._M_p,iVar19
              );
LAB_00186215:
    if (filepath._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)filepath._M_dataplus._M_p + 0x28))();
    }
    if (filename._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)filename._M_dataplus._M_p + 0x28))();
    }
  }
  return;
}

Assistant:

void process_single_task(server_task && task) {
        switch (task.type) {
            case SERVER_TASK_TYPE_COMPLETION:
            case SERVER_TASK_TYPE_INFILL:
            case SERVER_TASK_TYPE_EMBEDDING:
            case SERVER_TASK_TYPE_RERANK:
                {
                    const int id_slot = task.id_selected_slot;

                    server_slot * slot = id_slot != -1 ? get_slot_by_id(id_slot) : get_available_slot(task);

                    if (slot == nullptr) {
                        // if no slot is available, we defer this task for processing later
                        SRV_DBG("no slot is available, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    if (!launch_slot_with_task(*slot, std::move(task))) {
                        SRV_ERR("failed to launch slot with task, id_task = %d\n", task.id);
                        break;
                    }
                } break;
            case SERVER_TASK_TYPE_CANCEL:
                {
                    // release slot linked with the task id
                    for (auto & slot : slots) {
                        if (slot.id_task == task.id_target) {
                            slot.release();
                            break;
                        }
                    }
                } break;
            case SERVER_TASK_TYPE_NEXT_RESPONSE:
                {
                    // do nothing
                } break;
            case SERVER_TASK_TYPE_METRICS:
                {
                    json slots_data = json::array();

                    int n_idle_slots       = 0;
                    int n_processing_slots = 0;

                    for (server_slot & slot : slots) {
                        json slot_data = slot.to_json();

                        if (slot.is_processing()) {
                            n_processing_slots++;
                        } else {
                            n_idle_slots++;
                        }

                        slots_data.push_back(slot_data);
                    }
                    SRV_DBG("n_idle_slots = %d, n_processing_slots = %d\n", n_idle_slots, n_processing_slots);

                    auto res = std::make_unique<server_task_result_metrics>();
                    res->id                  = task.id;
                    res->slots_data          = std::move(slots_data);
                    res->n_idle_slots        = n_idle_slots;
                    res->n_processing_slots  = n_processing_slots;
                    res->n_tasks_deferred    = queue_tasks.queue_tasks_deferred.size();
                    res->t_start             = metrics.t_start;

                    res->kv_cache_tokens_count = llama_kv_self_n_tokens(ctx);
                    res->kv_cache_used_cells   = llama_kv_self_used_cells(ctx);

                    res->n_prompt_tokens_processed_total = metrics.n_prompt_tokens_processed_total;
                    res->t_prompt_processing_total       = metrics.t_prompt_processing_total;
                    res->n_tokens_predicted_total        = metrics.n_tokens_predicted_total;
                    res->t_tokens_generation_total       = metrics.t_tokens_generation_total;

                    res->n_prompt_tokens_processed = metrics.n_prompt_tokens_processed;
                    res->t_prompt_processing       = metrics.t_prompt_processing;
                    res->n_tokens_predicted        = metrics.n_tokens_predicted;
                    res->t_tokens_generation       = metrics.t_tokens_generation;

                    res->n_decode_total          = metrics.n_decode_total;
                    res->n_busy_slots_total      = metrics.n_busy_slots_total;

                    if (task.metrics_reset_bucket) {
                        metrics.reset_bucket();
                    }
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_SAVE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const size_t token_count = slot->cache_tokens.size();
                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    const size_t nwrite = llama_state_seq_save_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_save_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = true;
                    res->n_tokens = token_count;
                    res->n_bytes  = nwrite;
                    res->t_ms     = t_save_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_RESTORE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    const int64_t t_start = ggml_time_us();

                    std::string filename = task.slot_action.filename;
                    std::string filepath = task.slot_action.filepath;

                    slot->cache_tokens.resize(slot->n_ctx);
                    size_t token_count = 0;
                    size_t nread = llama_state_seq_load_file(ctx, filepath.c_str(), slot->id, slot->cache_tokens.data(), slot->cache_tokens.size(), &token_count);
                    if (nread == 0) {
                        slot->cache_tokens.resize(0);
                        send_error(task, "Unable to restore slot, no available space in KV cache or invalid slot save file", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    slot->cache_tokens.resize(token_count);

                    const int64_t t_end = ggml_time_us();
                    const double t_restore_ms = (t_end - t_start) / 1000.0;

                    auto res = std::make_unique<server_task_result_slot_save_load>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->filename = filename;
                    res->is_save  = false;
                    res->n_tokens = token_count;
                    res->n_bytes  = nread;
                    res->t_ms     = t_restore_ms;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SLOT_ERASE:
                {
                    int id_slot = task.slot_action.slot_id;
                    server_slot * slot = get_slot_by_id(id_slot);
                    if (slot == nullptr) {
                        send_error(task, "Invalid slot ID", ERROR_TYPE_INVALID_REQUEST);
                        break;
                    }
                    if (slot->is_processing()) {
                        // if requested slot is unavailable, we defer this task for processing later
                        SRV_DBG("requested slot is unavailable, defer task, id_task = %d\n", task.id);
                        queue_tasks.defer(std::move(task));
                        break;
                    }

                    // Erase token cache
                    const size_t n_erased = slot->cache_tokens.size();
                    llama_kv_self_seq_rm(ctx, slot->id, -1, -1);
                    slot->cache_tokens.clear();

                    auto res = std::make_unique<server_task_result_slot_erase>();
                    res->id       = task.id;
                    res->id_slot  = id_slot;
                    res->n_erased = n_erased;
                    queue_results.send(std::move(res));
                } break;
            case SERVER_TASK_TYPE_SET_LORA:
                {
                    params_base.lora_adapters = std::move(task.set_lora);
                    auto res = std::make_unique<server_task_result_apply_lora>();
                    res->id = task.id;
                    queue_results.send(std::move(res));
                } break;
        }
    }